

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BranchLayerParams::BranchLayerParams
          (BranchLayerParams *this,BranchLayerParams *from)

{
  void *pvVar1;
  NeuralNetwork *pNVar2;
  NeuralNetwork *pNVar3;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BranchLayerParams_003d2818;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pNVar2 = from->ifbranch_;
  if (pNVar2 == (NeuralNetwork *)0x0 ||
      from == (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    pNVar3 = (NeuralNetwork *)0x0;
  }
  else {
    pNVar3 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(pNVar3,pNVar2);
  }
  this->ifbranch_ = pNVar3;
  pNVar2 = from->elsebranch_;
  if (pNVar2 == (NeuralNetwork *)0x0 ||
      from == (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    pNVar3 = (NeuralNetwork *)0x0;
  }
  else {
    pNVar3 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(pNVar3,pNVar2);
  }
  this->elsebranch_ = pNVar3;
  return;
}

Assistant:

BranchLayerParams::BranchLayerParams(const BranchLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_ifbranch()) {
    ifbranch_ = new ::CoreML::Specification::NeuralNetwork(*from.ifbranch_);
  } else {
    ifbranch_ = NULL;
  }
  if (from.has_elsebranch()) {
    elsebranch_ = new ::CoreML::Specification::NeuralNetwork(*from.elsebranch_);
  } else {
    elsebranch_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BranchLayerParams)
}